

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void test_to<char>(char *s,uint codepoint)

{
  bool bVar1;
  code_point cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  string *s_00;
  code_point in_ESI;
  char *in_RDI;
  char *end;
  char *begin;
  string *in_stack_fffffffffffffd38;
  runtime_error *in_stack_fffffffffffffd40;
  runtime_error *this;
  char **in_stack_fffffffffffffd48;
  allocator local_209;
  string local_208 [38];
  undefined1 local_1e2;
  undefined1 local_1e1 [39];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *local_18;
  code_point local_c;
  char *local_8;
  
  for (local_20 = in_RDI; *local_20 != '\0'; local_20 = local_20 + 1) {
  }
  test_counter = test_counter + 2;
  local_18 = in_RDI;
  local_c = in_ESI;
  local_8 = in_RDI;
  cVar2 = booster::locale::utf::utf_traits<char,1>::decode<char_const*>
                    (in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
  if (cVar2 != local_c) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x51);
    poVar5 = std::operator<<(poVar5," tr::template decode<CharType const *>(begin,end) == codepoint"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar3 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar1) {
      local_55 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Error limits reached, stopping unit test",&local_41);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_55 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (((local_c == 0xfffffffe) || (local_c != 0xffffffff)) &&
     (test_counter = test_counter + 1, local_20 != local_18)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x54);
    poVar5 = std::operator<<(poVar5," end == begin");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar3 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar1) {
      local_7a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"Error limits reached, stopping unit test",&local_79);
      booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_7a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (local_c == 0xfffffffe) {
    test_counter = test_counter + 1;
    if ((*local_8 != '\0') &&
       (iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*local_8), iVar3 < 1)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
      poVar5 = std::operator<<(poVar5," *s== 0 || 0 < tr::trail_length(*s)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_a2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"Error limits reached, stopping unit test",&local_a1);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_a2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*local_8);
    if ((long)(iVar3 + 1) <= (long)local_20 - (long)local_8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x58);
      poVar5 = std::operator<<(poVar5," tr::trail_length(*s) + 1 > end - s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_ca = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"Error limits reached, stopping unit test",&local_c9);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_ca = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  if ((local_c != 0xfffffffe) && (local_c != 0xffffffff)) {
    local_18 = local_8;
    test_counter = test_counter + 1;
    bVar1 = booster::locale::utf::utf_traits<char,_1>::is_lead('\0');
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
      poVar5 = std::operator<<(poVar5," tr::is_lead(*begin)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_f2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"Error limits reached, stopping unit test",&local_f1);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_f2 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    bVar1 = booster::locale::utf::utf_traits<char,_1>::is_trail(*local_18);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5e);
      poVar5 = std::operator<<(poVar5," !tr::is_trail(*begin)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_11a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_118,"Error limits reached, stopping unit test",&local_119);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_11a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    while (local_18 = local_18 + 1, local_18 != local_20) {
      test_counter = test_counter + 1;
      bVar1 = booster::locale::utf::utf_traits<char,_1>::is_trail(*local_18);
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x61);
        poVar5 = std::operator<<(poVar5," tr::is_trail(*begin)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          local_142 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_140,"Error limits reached, stopping unit test",&local_141);
          booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38)
          ;
          local_142 = 0;
          __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                     );
        }
      }
      test_counter = test_counter + 1;
      bVar1 = booster::locale::utf::utf_traits<char,_1>::is_lead('\0');
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x62);
        poVar5 = std::operator<<(poVar5," !tr::is_lead(*begin)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          local_16a = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_168,"Error limits reached, stopping unit test",&local_169);
          booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38)
          ;
          local_16a = 0;
          __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                     );
        }
      }
    }
    test_counter = test_counter + 1;
    iVar3 = booster::locale::utf::utf_traits<char,_1>::width(local_c);
    if ((long)iVar3 != (long)local_20 - (long)local_8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x65);
      poVar5 = std::operator<<(poVar5," tr::width(codepoint)==end - s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_192 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_190,"Error limits reached, stopping unit test",&local_191);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_192 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*local_8);
    iVar4 = booster::locale::utf::utf_traits<char,_1>::width(local_c);
    if (iVar3 != iVar4 + -1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x66);
      poVar5 = std::operator<<(poVar5," tr::trail_length(*s) == tr::width(codepoint) - 1");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_1ba = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b8,"Error limits reached, stopping unit test",&local_1b9);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        local_1ba = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    local_18 = local_8;
    test_counter = test_counter + 1;
    cVar2 = booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(&local_18);
    if (cVar2 != local_c) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x68);
      poVar5 = std::operator<<(poVar5," tr::decode_valid(begin) == codepoint");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        local_1e2 = 1;
        s_00 = (string *)__cxa_allocate_exception(0x30);
        this = (runtime_error *)local_1e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1e1 + 1),"Error limits reached, stopping unit test",
                   (allocator *)this);
        booster::runtime_error::runtime_error(this,s_00);
        local_1e2 = 0;
        __cxa_throw(s_00,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    test_counter = test_counter + 1;
    if (local_18 != local_20) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x69);
      poVar5 = std::operator<<(poVar5," begin == end");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_208,"Error limits reached, stopping unit test",&local_209);
        booster::runtime_error::runtime_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void test_to(CharType const *s,unsigned codepoint)
{
    CharType const *begin = s;
    CharType const *end = begin;

    while(*end)
        end++;

    typedef utf_traits<CharType> tr;
    
    TEST(tr::max_width == 4 / sizeof(CharType));

    TEST(tr::template decode<CharType const *>(begin,end) == codepoint);

    if(codepoint == incomplete || codepoint != illegal)
        TEST(end == begin);

    if(codepoint == incomplete) {
        TEST(*s== 0 || 0 < tr::trail_length(*s));
        TEST(tr::trail_length(*s) + 1 > end - s);
    }

    if(codepoint != incomplete && codepoint != illegal) {
        begin=s;
        TEST(tr::is_lead(*begin));
        TEST(!tr::is_trail(*begin));
        begin++;
        while(begin!=end) {
            TEST(tr::is_trail(*begin));
            TEST(!tr::is_lead(*begin));
            begin++;
        }
        TEST(tr::width(codepoint)==end - s);
        TEST(tr::trail_length(*s) == tr::width(codepoint) - 1);
        begin = s;
        TEST(tr::decode_valid(begin) == codepoint);
        TEST(begin == end);
    }
}